

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_divVecScalar_vec2(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  fVar1 = c->in[1].m_data[0];
  fVar2 = c->in[1].m_data[1];
  auVar3._4_4_ = c->in[0].m_data[1];
  auVar3._0_4_ = c->in[0].m_data[3];
  auVar3._8_4_ = c->in[1].m_data[0];
  auVar3._12_4_ = 0;
  auVar4._4_4_ = fVar1;
  auVar4._0_4_ = fVar1;
  auVar4._8_4_ = fVar2;
  auVar4._12_4_ = fVar2;
  auVar4 = divps(auVar3,auVar4);
  *(long *)((c->color).m_data + 1) = auVar4._0_8_;
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }